

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_finish_test_line_(acutest_state_ state)

{
  char *pcVar1;
  int in_EDI;
  char *pcVar2;
  char *str;
  int color;
  char *local_10;
  uint local_8;
  
  if (acutest_tap_ == 0) {
    if (in_EDI == 0) {
      local_8 = 0xc;
      local_10 = "OK";
    }
    else if ((in_EDI == 1) || (in_EDI != 2)) {
      local_8 = 0xb;
      local_10 = "FAILED";
    }
    else {
      local_8 = 0xd;
      local_10 = "SKIPPED";
    }
    printf("[ ");
    acutest_colored_printf_((int)(ulong)local_8,"%s",local_10);
    printf(" ]");
    if ((in_EDI == 0) && (acutest_timer_ != 0)) {
      printf("  ");
      acutest_timer_print_diff_();
    }
    printf("\n");
  }
  else {
    pcVar1 = "not ok";
    if (in_EDI == 0 || in_EDI == 2) {
      pcVar1 = "ok";
    }
    pcVar2 = "";
    if (in_EDI == 2) {
      pcVar2 = " # SKIP";
    }
    printf("%s %d - %s%s\n",pcVar1,(ulong)(acutest_current_index_ + 1),acutest_current_test_->name,
           pcVar2);
    if ((in_EDI == 0) && (acutest_timer_ != 0)) {
      printf("# Duration: ");
      acutest_timer_print_diff_();
      printf("\n");
    }
  }
  return;
}

Assistant:

static void
acutest_finish_test_line_(enum acutest_state_ state)
{
    if(acutest_tap_) {
        printf("%s %d - %s%s\n",
                (state == ACUTEST_STATE_SUCCESS || state == ACUTEST_STATE_SKIPPED) ? "ok" : "not ok",
                acutest_current_index_ + 1,
                acutest_current_test_->name,
                (state == ACUTEST_STATE_SKIPPED) ? " # SKIP" : "");

        if(state == ACUTEST_STATE_SUCCESS  &&  acutest_timer_) {
            printf("# Duration: ");
            acutest_timer_print_diff_();
            printf("\n");
        }
    } else {
        int color;
        const char* str;

        switch(state) {
            case ACUTEST_STATE_SUCCESS: color = ACUTEST_COLOR_GREEN_INTENSIVE_; str = "OK"; break;
            case ACUTEST_STATE_SKIPPED: color = ACUTEST_COLOR_YELLOW_INTENSIVE_; str = "SKIPPED"; break;
            case ACUTEST_STATE_FAILED:  /* Fall through. */
            default:                    color = ACUTEST_COLOR_RED_INTENSIVE_; str = "FAILED"; break;
        }

        printf("[ ");
        acutest_colored_printf_(color, "%s", str);
        printf(" ]");

        if(state == ACUTEST_STATE_SUCCESS  &&  acutest_timer_) {
            printf("  ");
            acutest_timer_print_diff_();
        }

        printf("\n");
    }
}